

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

int32 __thiscall nuraft::raft_server::get_leadership_expiry(raft_server *this)

{
  __int_type_conflict1 _Var1;
  element_type *peVar2;
  context *in_RDI;
  int expiry;
  ptr<raft_params> params;
  int local_1c;
  __atomic_base<int> *in_stack_ffffffffffffffe8;
  
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x32ac1a);
  nuraft::context::get_params(in_RDI);
  peVar2 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x32ac31);
  local_1c = peVar2->leadership_expiry_;
  if (local_1c == 0) {
    peVar2 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x32ac49);
    local_1c = peVar2->heart_beat_interval_;
    _Var1 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffffe8);
    local_1c = local_1c * _Var1;
  }
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x32ac7f);
  return local_1c;
}

Assistant:

int32 raft_server::get_leadership_expiry() {
    ptr<raft_params> params = ctx_->get_params();
    int expiry = params->leadership_expiry_;
    if (expiry == 0) {
        // If 0, default expiry: 20x of heartbeat.
        expiry = params->heart_beat_interval_ *
                     raft_server::raft_limits_.leadership_limit_;
    }
    return expiry;
}